

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Au_Man_t * Au_ManAlloc(char *pName)

{
  Au_Man_t *pAVar1;
  char *pcVar2;
  
  pAVar1 = (Au_Man_t *)calloc(1,0x40);
  pcVar2 = Au_UtilStrsav(pName);
  pAVar1->pName = pcVar2;
  Vec_PtrGrow(&pAVar1->vNtks,0x6f);
  Vec_PtrPush(&pAVar1->vNtks,(void *)0x0);
  return pAVar1;
}

Assistant:

Au_Man_t * Au_ManAlloc( char * pName )
{
    Au_Man_t * p;
    p = ABC_CALLOC( Au_Man_t, 1 );
    p->pName = Au_UtilStrsav( pName );
    Vec_PtrGrow( &p->vNtks,  111 );
    Vec_PtrPush( &p->vNtks, NULL );
    return p;
}